

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O3

void insert_heap(U32Pair *min_heap,u32 index,u32 value,u32 count)

{
  U32Pair UVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  min_heap[index].value = value;
  min_heap[index].count = count;
  uVar3 = (ulong)index;
  if (index != 0) {
    do {
      uVar2 = (int)uVar3 - 1;
      uVar4 = (ulong)(uVar2 >> 1);
      if (min_heap[uVar4].count <= min_heap[uVar3].count) {
        return;
      }
      UVar1 = min_heap[uVar4];
      min_heap[uVar4] = min_heap[uVar3];
      min_heap[uVar3] = UVar1;
      uVar3 = uVar4;
    } while (1 < uVar2);
  }
  return;
}

Assistant:

void insert_heap(U32Pair* min_heap, u32 index, u32 value, u32 count) {
  min_heap[index].value = value;
  min_heap[index].count = count;
  while (index > 0) {
    u32 parent = (index - 1) / 2;
    if (min_heap[parent].count <= min_heap[index].count) {
      break;
    }
    swap_pair(&min_heap[parent], &min_heap[index]);
    index = parent;
  }
}